

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O3

bool __thiscall RTIMUMagCal::magCalSaveRaw(RTIMUMagCal *this,char *ellipsoidFitPath)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  FILE *__stream;
  bool bVar3;
  RTVector3 RVar4;
  
  bVar3 = true;
  if (ellipsoidFitPath != (char *)0x0) {
    sVar2 = strlen(ellipsoidFitPath);
    __s = (char *)malloc(sVar2 + 0xc);
    sprintf(__s,"%s/%s",ellipsoidFitPath,"magRaw.dta");
    __stream = fopen(__s,"w");
    if (__stream == (FILE *)0x0) {
      magCalSaveRaw();
      bVar3 = false;
    }
    else {
      iVar1 = this->m_magCalCount;
      while (0 < iVar1) {
        RVar4 = removeMagCalData(this);
        fprintf(__stream,"%f %f %f\n",(double)RVar4.m_data[0],SUB84((double)RVar4.m_data[1],0),
                (double)RVar4.m_data[2]);
        iVar1 = this->m_magCalCount;
      }
      fclose(__stream);
    }
  }
  return bVar3;
}

Assistant:

bool RTIMUMagCal::magCalSaveRaw(const char *ellipsoidFitPath)
{
    FILE *file;
    char *rawFile;

    if (ellipsoidFitPath != NULL) {
        // need to deal with ellipsoid fit processing
        rawFile = (char *)malloc(strlen(RTIMUCALDEFS_MAG_RAW_FILE) + strlen(ellipsoidFitPath) + 2);
        sprintf(rawFile, "%s/%s", ellipsoidFitPath, RTIMUCALDEFS_MAG_RAW_FILE);
        if ((file = fopen(rawFile, "w")) == NULL) {
            HAL_ERROR("Failed to open ellipsoid fit raw data file\n");
            return false;
        }
        while (m_magCalCount > 0) {
            RTVector3 sample = removeMagCalData();
            fprintf(file, "%f %f %f\n", sample.x(), sample.y(), sample.z());
        }
        fclose(file);
    }
    return true;
}